

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

void Exp_Truth8(int nVars,Vec_Int_t *p,word **puFanins,word *puRes)

{
  uint Lit;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *__ptr;
  long lVar5;
  long lVar6;
  word *pwVar7;
  word *pwVar8;
  word (*__dest) [4];
  void *pvVar9;
  void *pvVar10;
  int i;
  word **local_1a8;
  word *puFaninsInt [8];
  word Truth8 [8] [4];
  
  __dest = Truth8;
  memcpy(__dest,&DAT_00806000,0x100);
  Lit = Vec_IntEntryLast(p);
  local_1a8 = puFanins;
  if (puFanins == (word **)0x0) {
    local_1a8 = puFaninsInt;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      puFaninsInt[lVar6] = *__dest;
      __dest = __dest + 1;
    }
  }
  iVar3 = p->nSize;
  if (iVar3 + 1U < 3) {
    if (nVars * 2 <= (int)Lit) {
      __assert_fail("iRoot < 2 * nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/exp.h"
                    ,0xe3,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
    }
    if (Lit < 0xfffffffe) {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        iVar3 = Abc_LitIsCompl(Lit);
        uVar4 = Abc_Lit2Var(Lit);
        puRes[lVar6] = (long)-iVar3 ^ local_1a8[uVar4][lVar6];
      }
    }
    else {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        puRes[lVar6] = -(ulong)(Lit != 0xffffffff);
      }
    }
  }
  else {
    __ptr = calloc((long)(iVar3 / 2 << 2),8);
    pvVar10 = (void *)0x0;
    pvVar9 = __ptr;
    for (lVar6 = 0; iVar2 = (int)lVar6, lVar6 < iVar3 / 2; lVar6 = lVar6 + 1) {
      iVar3 = Vec_IntEntry(p,iVar2 * 2);
      uVar4 = Abc_Lit2Var(iVar3);
      i = iVar2 * 2 + 1;
      iVar3 = Vec_IntEntry(p,i);
      uVar1 = Abc_Lit2Var(iVar3);
      iVar3 = Vec_IntEntry(p,iVar2 * 2);
      iVar3 = Abc_LitIsCompl(iVar3);
      iVar2 = Vec_IntEntry(p,i);
      iVar2 = Abc_LitIsCompl(iVar2);
      if ((int)uVar4 < nVars) {
        pwVar7 = local_1a8[uVar4];
      }
      else {
        pwVar7 = (word *)((long)__ptr + (long)(int)((uVar4 - nVars) * 4) * 8);
      }
      if ((int)uVar1 < nVars) {
        pwVar8 = local_1a8[uVar1];
      }
      else {
        pwVar8 = (word *)((long)__ptr + (long)(int)((uVar1 - nVars) * 4) * 8);
      }
      if (iVar2 == 0 || iVar3 == 0) {
        if (iVar3 == 0 || (byte)iVar2 != 0) {
          if ((iVar3 == 0 & (byte)iVar2) == 0) {
            for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
              *(word *)((long)pvVar9 + lVar5 * 8) = pwVar8[lVar5] & pwVar7[lVar5];
            }
          }
          else {
            for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
              *(word *)((long)pvVar9 + lVar5 * 8) = ~pwVar8[lVar5] & pwVar7[lVar5];
            }
          }
        }
        else {
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            *(word *)((long)pvVar9 + lVar5 * 8) = ~pwVar7[lVar5] & pwVar8[lVar5];
          }
        }
      }
      else {
        for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
          *(word *)((long)pvVar9 + lVar5 * 8) = ~(pwVar8[lVar5] | pwVar7[lVar5]);
        }
      }
      pvVar10 = (void *)(lVar6 * 0x20 + (long)__ptr);
      iVar3 = p->nSize;
      pvVar9 = (void *)((long)pvVar9 + 0x20);
    }
    iVar3 = Abc_Lit2Var(Lit);
    if (iVar3 - nVars != iVar2 + -1) {
      __assert_fail("Abc_Lit2Var(iRoot) - nVars == i - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/exp.h"
                    ,0x103,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
    }
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      iVar3 = Abc_LitIsCompl(Lit);
      puRes[lVar6] = (long)-iVar3 ^ *(ulong *)((long)pvVar10 + lVar6 * 8);
    }
    free(__ptr);
  }
  return;
}

Assistant:

static inline void Exp_Truth8( int nVars, Vec_Int_t * p, word ** puFanins, word * puRes )
{
    word Truth8[8][4] = {
        { ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA) },
        { ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC) },
        { ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0) },
        { ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00) },
        { ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000) },
        { ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000) },
        { ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF),ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF) },
        { ABC_CONST(0x0000000000000000),ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF),ABC_CONST(0xFFFFFFFFFFFFFFFF) }
    };
    word * puFaninsInt[8], * pStore, * pThis = NULL;
    int i, k, iRoot = Vec_IntEntryLast(p);
    if ( puFanins == NULL )
    {
        puFanins = puFaninsInt;
        for ( k = 0; k < 8; k++ )
            puFanins[k] = Truth8[k];
    }
    if ( Exp_NodeNum(p) == 0 )
    {
        assert( iRoot < 2 * nVars );
        if ( iRoot == EXP_CONST0 || iRoot == EXP_CONST1 )
            for ( k = 0; k < 4; k++ )
                puRes[k] = iRoot == EXP_CONST0 ? 0 : ~(word)0;
        else
            for ( k = 0; k < 4; k++ )
                puRes[k] = Abc_LitIsCompl(iRoot) ? ~puFanins[Abc_Lit2Var(iRoot)][k] : puFanins[Abc_Lit2Var(iRoot)][k];
        return;
    }
    pStore = ABC_CALLOC( word, 4 * Exp_NodeNum(p) );
    for ( i = 0; i < Exp_NodeNum(p); i++ )
    {
        int iVar0 = Abc_Lit2Var( Vec_IntEntry(p, 2*i+0) );
        int iVar1 = Abc_Lit2Var( Vec_IntEntry(p, 2*i+1) );
        int fCompl0 = Abc_LitIsCompl( Vec_IntEntry(p, 2*i+0) );
        int fCompl1 = Abc_LitIsCompl( Vec_IntEntry(p, 2*i+1) );
        word * pIn0 = iVar0 < nVars ? puFanins[iVar0] : pStore + 4 * (iVar0 - nVars);
        word * pIn1 = iVar1 < nVars ? puFanins[iVar1] : pStore + 4 * (iVar1 - nVars);
        pThis = pStore + 4 * i;
        if ( fCompl0 && fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] = ~pIn0[k] & ~pIn1[k];
        else if ( fCompl0 && !fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] = ~pIn0[k] &  pIn1[k];
        else if ( !fCompl0 && fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] =  pIn0[k] & ~pIn1[k];
        else //if ( !fCompl0 && !fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] =  pIn0[k] &  pIn1[k];
    }
    assert( Abc_Lit2Var(iRoot) - nVars == i - 1 );
    for ( k = 0; k < 4; k++ )
        puRes[k] = Abc_LitIsCompl(iRoot) ? ~pThis[k] : pThis[k];
    ABC_FREE( pStore );
}